

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int zisofs_rewind_boot_file(archive_write *a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uchar *p;
  void *__buf;
  __off_t __offset;
  ssize_t sVar7;
  uint *puVar8;
  ssize_t sVar9;
  archive *in_RDI;
  ssize_t rs;
  size_t rsize;
  int ret;
  int fd;
  int64_t new_offset;
  int64_t write_offset;
  int64_t read_offset;
  zisofs_extract zext;
  size_t rbuff_size;
  size_t remaining;
  ssize_t r;
  uchar *rbuff;
  isofile *file;
  iso9660_conflict *iso9660;
  size_t in_stack_fffffffffffffed8;
  __off_t local_108;
  undefined4 in_stack_ffffffffffffff04;
  zisofs_extract *in_stack_ffffffffffffff10;
  archive_write *in_stack_ffffffffffffff18;
  void *local_e0;
  undefined1 auStack_b8 [72];
  int local_48;
  size_t local_40;
  ulong local_38;
  int local_4;
  
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  local_4 = 0;
  lVar2 = *(long *)(*(long *)(lVar1 + 0x10340) + 0x18);
  if (*(char *)(lVar2 + 0xc0) == '\0') {
    local_4 = 0;
  }
  else {
    memset(&stack0xffffffffffffff00,0,0xc0);
    p = (uchar *)(ulong)*(uint *)(lVar2 + 0xc4);
    uVar5 = (uint)*(byte *)(lVar2 + 0xc1);
    iVar6 = *(int *)(lVar1 + 8);
    lVar3 = *(long *)(*(long *)&in_RDI[1].current_codepage + 0x102f0);
    lVar4 = *(long *)(*(long *)&in_RDI[1].current_codepage + 0x102e0);
    local_108 = *(__off_t *)(lVar2 + 0x90);
    local_38 = *(ulong *)(lVar2 + 0x98);
    local_40 = local_38;
    if (0x8000 < local_38) {
      local_40 = 0x8000;
    }
    __buf = malloc(local_40);
    if (__buf == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
      local_4 = -0x1e;
    }
    else {
      do {
        if (local_38 == 0) goto LAB_002a1c27;
        __offset = lseek(iVar6,0,1);
        lseek(iVar6,local_108,0);
        in_stack_fffffffffffffed8 = local_40;
        if (local_38 < local_40) {
          in_stack_fffffffffffffed8 = local_38;
        }
        sVar7 = read(*(int *)(lVar1 + 8),__buf,in_stack_fffffffffffffed8);
        if (sVar7 < 1) {
          puVar8 = (uint *)__errno_location();
          archive_set_error(in_RDI,(int)(ulong)*puVar8,"Can\'t read temporary file(%jd)",sVar7);
          local_4 = -0x1e;
          goto LAB_002a1c27;
        }
        local_38 = local_38 - sVar7;
        local_108 = sVar7 + local_108;
        lseek(iVar6,__offset,0);
        sVar9 = zisofs_extract(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,p,
                               CONCAT44(in_stack_ffffffffffffff04,uVar5));
      } while (-1 < sVar9);
      local_4 = (int)sVar9;
LAB_002a1c27:
      if (local_4 == 0) {
        *(long *)(lVar2 + 0x90) = (lVar3 + 0x10000) - lVar4;
        *(ulong *)(lVar2 + 0x98) = (ulong)*(uint *)(lVar2 + 0xc4);
        archive_entry_set_size(*(archive_entry **)(lVar2 + 0x20),*(int64_t *)(lVar2 + 0x98));
        *(undefined1 *)(lVar2 + 0xc0) = 0;
        *(undefined1 *)(lVar2 + 0xc1) = 0;
        *(undefined4 *)(lVar2 + 0xc4) = 0;
        iVar6 = wb_write_padding_to_temp
                          ((archive_write *)CONCAT44(iVar6,local_4),in_stack_fffffffffffffed8);
        if (iVar6 < 0) {
          local_4 = -0x1e;
        }
      }
      free(__buf);
      free(local_e0);
      if ((local_48 != 0) && (iVar6 = inflateEnd(auStack_b8), iVar6 != 0)) {
        archive_set_error(in_RDI,-1,"Failed to clean up compressor");
        local_4 = -0x1e;
      }
    }
  }
  return local_4;
}

Assistant:

static int
zisofs_rewind_boot_file(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	unsigned char *rbuff;
	ssize_t r;
	size_t remaining, rbuff_size;
	struct zisofs_extract zext;
	int64_t read_offset, write_offset, new_offset;
	int fd, ret = ARCHIVE_OK;

	file = iso9660->el_torito.boot->file;
	/*
	 * There is nothing to do if this boot file does not have
	 * zisofs header.
	 */
	if (file->zisofs.header_size == 0)
		return (ARCHIVE_OK);

	/*
	 * Uncompress the zisofs'ed file contents.
	 */
	memset(&zext, 0, sizeof(zext));
	zext.pz_uncompressed_size = file->zisofs.uncompressed_size;
	zext.pz_log2_bs = file->zisofs.log2_bs;

	fd = iso9660->temp_fd;
	new_offset = wb_offset(a);
	read_offset = file->content.offset_of_temp;
	remaining = (size_t)file->content.size;
	if (remaining > 1024 * 32)
		rbuff_size = 1024 * 32;
	else
		rbuff_size = remaining;

	rbuff = malloc(rbuff_size);
	if (rbuff == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	while (remaining) {
		size_t rsize;
		ssize_t rs;

		/* Get the current file pointer. */
		write_offset = lseek(fd, 0, SEEK_CUR);

		/* Change the file pointer to read. */
		lseek(fd, read_offset, SEEK_SET);

		rsize = rbuff_size;
		if (rsize > remaining)
			rsize = remaining;
		rs = read(iso9660->temp_fd, rbuff, rsize);
		if (rs <= 0) {
			archive_set_error(&a->archive, errno,
			    "Can't read temporary file(%jd)", (intmax_t)rs);
			ret = ARCHIVE_FATAL;
			break;
		}
		remaining -= rs;
		read_offset += rs;

		/* Put the file pointer back to write. */
		lseek(fd, write_offset, SEEK_SET);

		r = zisofs_extract(a, &zext, rbuff, rs);
		if (r < 0) {
			ret = (int)r;
			break;
		}
	}

	if (ret == ARCHIVE_OK) {
		/*
		 * Change the boot file content from zisofs'ed data
		 * to plain data.
		 */
		file->content.offset_of_temp = new_offset;
		file->content.size = file->zisofs.uncompressed_size;
		archive_entry_set_size(file->entry, file->content.size);
		/* Set to be no zisofs. */
		file->zisofs.header_size = 0;
		file->zisofs.log2_bs = 0;
		file->zisofs.uncompressed_size = 0;
		r = wb_write_padding_to_temp(a, file->content.size);
		if (r < 0)
			ret = ARCHIVE_FATAL;
	}

	/*
	 * Free the resource we used in this function only.
	 */
	free(rbuff);
	free(zext.block_pointers);
	if (zext.stream_valid && inflateEnd(&(zext.stream)) != Z_OK) {
        	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		ret = ARCHIVE_FATAL;
	}

	return (ret);
}